

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeURLPush(xmlXIncludeCtxtPtr ctxt,xmlChar *value)

{
  xmlChar **ppxVar1;
  xmlChar *pxVar2;
  xmlChar *value_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if (ctxt->urlNr < 0x29) {
    if (ctxt->urlTab == (xmlChar **)0x0) {
      ctxt->urlMax = 4;
      ctxt->urlNr = 0;
      ppxVar1 = (xmlChar **)(*xmlMalloc)((long)ctxt->urlMax << 3);
      ctxt->urlTab = ppxVar1;
      if (ctxt->urlTab == (xmlChar **)0x0) {
        xmlXIncludeErrMemory(ctxt,(xmlNodePtr)0x0,"adding URL");
        return -1;
      }
    }
    if (ctxt->urlMax <= ctxt->urlNr) {
      ctxt->urlMax = ctxt->urlMax << 1;
      ppxVar1 = (xmlChar **)(*xmlRealloc)(ctxt->urlTab,(long)ctxt->urlMax << 3);
      ctxt->urlTab = ppxVar1;
      if (ctxt->urlTab == (xmlChar **)0x0) {
        xmlXIncludeErrMemory(ctxt,(xmlNodePtr)0x0,"adding URL");
        return -1;
      }
    }
    pxVar2 = xmlStrdup(value);
    ctxt->urlTab[ctxt->urlNr] = pxVar2;
    ctxt->url = pxVar2;
    ctxt_local._4_4_ = ctxt->urlNr;
    ctxt->urlNr = ctxt_local._4_4_ + 1;
  }
  else {
    xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,0x640,"detected a recursion in %s\n",value);
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXIncludeURLPush(xmlXIncludeCtxtPtr ctxt,
	           const xmlChar *value)
{
    if (ctxt->urlNr > XINCLUDE_MAX_DEPTH) {
	xmlXIncludeErr(ctxt, NULL, XML_XINCLUDE_RECURSION,
	               "detected a recursion in %s\n", value);
	return(-1);
    }
    if (ctxt->urlTab == NULL) {
	ctxt->urlMax = 4;
	ctxt->urlNr = 0;
	ctxt->urlTab = (xmlChar * *) xmlMalloc(
		        ctxt->urlMax * sizeof(ctxt->urlTab[0]));
        if (ctxt->urlTab == NULL) {
	    xmlXIncludeErrMemory(ctxt, NULL, "adding URL");
            return (-1);
        }
    }
    if (ctxt->urlNr >= ctxt->urlMax) {
        ctxt->urlMax *= 2;
        ctxt->urlTab =
            (xmlChar * *) xmlRealloc(ctxt->urlTab,
                                      ctxt->urlMax *
                                      sizeof(ctxt->urlTab[0]));
        if (ctxt->urlTab == NULL) {
	    xmlXIncludeErrMemory(ctxt, NULL, "adding URL");
            return (-1);
        }
    }
    ctxt->url = ctxt->urlTab[ctxt->urlNr] = xmlStrdup(value);
    return (ctxt->urlNr++);
}